

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_polygon_shape.cc
# Opt level: O0

S2Point * __thiscall
EncodedS2LaxPolygonShape::loop_vertex
          (S2Point *__return_storage_ptr__,EncodedS2LaxPolygonShape *this,int i,int j)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  S2LogMessage local_58;
  S2LogMessageVoidify local_45 [20];
  byte local_31;
  S2LogMessage local_30;
  S2LogMessageVoidify local_19;
  int local_18;
  int local_14;
  int j_local;
  int i_local;
  EncodedS2LaxPolygonShape *this_local;
  
  local_18 = j;
  local_14 = i;
  _j_local = this;
  iVar1 = num_loops(this);
  local_31 = 0;
  if (iVar1 <= i) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2lax_polygon_shape.cc"
               ,0x113,kFatal,(ostream *)&std::cerr);
    local_31 = 1;
    poVar4 = S2LogMessage::stream(&local_30);
    poVar4 = std::operator<<(poVar4,"Check failed: (i) < (num_loops()) ");
    S2LogMessageVoidify::operator&(&local_19,poVar4);
  }
  iVar1 = local_18;
  if ((local_31 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
  }
  iVar2 = num_loop_vertices(this,local_14);
  if (iVar2 <= iVar1) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2lax_polygon_shape.cc"
               ,0x114,kFatal,(ostream *)&std::cerr);
    poVar4 = S2LogMessage::stream(&local_58);
    poVar4 = std::operator<<(poVar4,"Check failed: (j) < (num_loop_vertices(i)) ");
    S2LogMessageVoidify::operator&(local_45,poVar4);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_58);
  }
  iVar1 = num_loops(this);
  if (iVar1 == 1) {
    s2coding::EncodedS2PointVector::operator[](__return_storage_ptr__,&this->vertices_,local_18);
  }
  else {
    uVar3 = s2coding::EncodedUintVector<unsigned_int>::operator[]
                      (&this->cumulative_vertices_,local_14);
    s2coding::EncodedS2PointVector::operator[]
              (__return_storage_ptr__,&this->vertices_,uVar3 + local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

S2Point EncodedS2LaxPolygonShape::loop_vertex(int i, int j) const {
  S2_DCHECK_LT(i, num_loops());
  S2_DCHECK_LT(j, num_loop_vertices(i));
  if (num_loops() == 1) {
    return vertices_[j];
  } else {
    return vertices_[cumulative_vertices_[i] + j];
  }
}